

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2010.hpp
# Opt level: O0

void bcl::st2010::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  reference pdVar1;
  reference pvVar2;
  const_reference pvVar3;
  double *pdVar4;
  reference this;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar5;
  double dVar6;
  size_t j;
  size_t i_1;
  size_t i;
  double shift;
  double sum;
  vector<double,_std::allocator<double>_> accum;
  size_t n;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe88;
  double in_stack_fffffffffffffe90;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe98;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  vector<double,_std::allocator<double>_> *this_00;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  ulong local_a0;
  ulong local_98;
  size_type local_90;
  double *local_88;
  double *local_80;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  double local_70;
  double *local_68;
  double *local_60;
  double local_58;
  undefined8 local_38;
  vector<double,_std::allocator<double>_> local_30;
  size_type local_18;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_38 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x10aa0d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8._M_current,
             in_stack_fffffffffffffea0._M_current,
             (allocator_type *)in_stack_fffffffffffffe98._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x10aa3e);
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe88);
  local_68 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe88);
  local_58 = std::
             accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90);
  local_80 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe88);
  local_88 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe88);
  local_78 = std::
             max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                       (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  pdVar1 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_78);
  local_70 = *pdVar1 / local_58;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
  *pvVar2 = 0.0;
  for (local_90 = 0; local_90 < local_18; local_90 = local_90 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_90);
    dVar5 = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_90);
    dVar6 = *pvVar3 / local_58;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_90 + 1);
    *pvVar2 = dVar5 + dVar6;
  }
  for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
    for (local_a0 = 0; local_a0 < local_18; local_a0 = local_a0 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98 + 1);
      local_b0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0 + 1);
      pdVar4 = std::min<double>(&local_b0,pvVar2);
      dVar5 = *pdVar4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_98);
      local_b8 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,local_a0);
      pdVar4 = std::max<double>(&local_b8,pvVar2);
      local_a8 = dVar5 - *pdVar4;
      local_c0 = 0.0;
      pdVar4 = std::max<double>(&local_a8,&local_c0);
      in_stack_fffffffffffffea0._M_current = (double *)*pdVar4;
      this_00 = &local_30;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_98 + 1);
      local_d0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_a0 + 1);
      local_d8 = *pvVar2 + 1.0;
      pdVar4 = std::min<double>(&local_d0,&local_d8);
      dVar5 = *pdVar4;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_98);
      local_e0 = *pvVar2 + local_70;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_a0);
      local_e8 = *pvVar2 + 1.0;
      pdVar4 = std::max<double>(&local_e0,&local_e8);
      local_c8 = dVar5 - *pdVar4;
      local_f0 = 0.0;
      pdVar4 = std::max<double>(&local_c8,&local_f0);
      dVar5 = (double)in_stack_fffffffffffffea0._M_current + *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_98);
      dVar5 = dVar5 / (*pvVar3 / local_58);
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](local_10,local_98);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this,local_a0);
      *pvVar2 = dVar5;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0._M_current);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0)) / (weights[i] / sum);
      }
    }
  }